

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void secp256k1_bulletproof_serialize_points(uchar *out,secp256k1_ge *pt,size_t n)

{
  int iVar1;
  ulong __n;
  ulong in_RDX;
  long in_RSI;
  void *in_RDI;
  secp256k1_fe pointx;
  size_t i;
  size_t bitveclen;
  undefined1 local_50 [32];
  secp256k1_fe *in_stack_ffffffffffffffd0;
  ulong local_28;
  
  __n = in_RDX + 7 >> 3;
  memset(in_RDI,0,__n);
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    memcpy(local_50,(void *)(in_RSI + local_28 * 0x58),0x28);
    secp256k1_fe_normalize((secp256k1_fe *)local_50);
    secp256k1_fe_get_b32((uchar *)((long)in_RDI + __n + local_28 * 0x20),(secp256k1_fe *)local_50);
    iVar1 = secp256k1_fe_is_quad_var(in_stack_ffffffffffffffd0);
    if (iVar1 == 0) {
      *(byte *)((long)in_RDI + (local_28 >> 3)) =
           *(byte *)((long)in_RDI + (local_28 >> 3)) | (byte)(1L << ((byte)local_28 & 7));
    }
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_bulletproof_serialize_points(unsigned char *out, secp256k1_ge *pt, size_t n) {
    const size_t bitveclen = (n + 7) / 8;
    size_t i;

    memset(out, 0, bitveclen);
    for (i = 0; i < n; i++) {
        secp256k1_fe pointx;
        pointx = pt[i].x;
        secp256k1_fe_normalize(&pointx);
        secp256k1_fe_get_b32(&out[bitveclen + i*32], &pointx);
        if (!secp256k1_fe_is_quad_var(&pt[i].y)) {
            out[i/8] |= (1ull << (i % 8));
        }
    }
}